

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expected.h
# Opt level: O0

void __thiscall
Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~Expected(Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if ((this->has_value_ & 1U) == 0) {
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this);
  }
  else {
    ProjectSettings::~ProjectSettings((ProjectSettings *)this);
  }
  return;
}

Assistant:

~Expected() {
		if (has_value_)
			value_.~T();
		else
			error_.~UnexpectedType();
	}